

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O1

void __thiscall DiskTable::persistent(DiskTable *this,MemTable *m,bool df)

{
  DiskTableNode *this_00;
  DiskViewLevelIter level;
  ulong uVar1;
  long *plVar2;
  pointer pSVar3;
  pointer pSVar4;
  SSTable *pSVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  SSTableData *datas;
  SSTableData *datas_1;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *pvVar8;
  size_t sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  SSTableDataEntry *pSVar11;
  DiskViewLevelIter level_00;
  _Self __tmp;
  size_t *psVar12;
  iterator __position;
  pointer s;
  size_t blocked_data_bytes;
  DiskTableNode new_disk_node;
  DiskTableNode persistent_node;
  list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  to_remove_file;
  anon_class_8_1_8991fb9c writeFileName;
  int local_11c;
  undefined1 local_118 [40];
  SSTableDataEntry *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  pointer local_d8;
  SSTableData local_c8;
  _List_node_base *local_a8;
  ulong local_a0;
  DiskTableNode local_98;
  DiskTableNode local_78;
  _List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  local_58;
  _List_node_base *local_40;
  anon_class_8_1_8991fb9c local_38;
  
  local_98._sstable = (SSTable *)0x0;
  local_98.filter = (Filter *)0x0;
  local_98.index = (IndexMap *)0x0;
  MemTable::collectData((SSTableData *)local_118,m);
  DiskTableNode::fillData(&local_98,(SSTableData *)local_118);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_118);
  level._M_current =
       (this->diskView).
       super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = ((level._M_current)->super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>).
          _M_impl._M_node._M_size;
  local_38.this = this;
  if (uVar1 < (ulong)(long)this->LEVEL0_LIMIT) {
    persistent::anon_class_8_1_8991fb9c::operator()((path *)local_118,&local_38,level);
    pSVar5 = local_98._sstable;
    if (local_98._sstable != (SSTable *)0x0) {
      SSTable::writeToDisk(local_98._sstable,(path *)local_118);
    }
    std::filesystem::__cxx11::path::~path((path *)local_118);
    SSTable::clearDataCache(pSVar5);
    p_Var7 = (_List_node_base *)operator_new(0x28);
    p_Var7[1]._M_next = (_List_node_base *)pSVar5;
    p_Var7[1]._M_prev = (_List_node_base *)local_98.filter;
    p_Var7[2]._M_next = (_List_node_base *)local_98.index;
    local_98._sstable = (SSTable *)0x0;
    local_98.filter = (Filter *)0x0;
    local_98.index = (IndexMap *)0x0;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar12 = &((level._M_current)->super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>)
               ._M_impl._M_node._M_size;
    *psVar12 = *psVar12 + 1;
  }
  else if (uVar1 == (long)this->LEVEL0_LIMIT) {
    level_00._M_current = level._M_current + 1;
    local_40 = (_List_node_base *)level._M_current;
    if (level_00._M_current ==
        (this->diskView).
        super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_118._16_8_ = (pointer)0x0;
      local_118._0_8_ = local_118;
      local_118._8_8_ = local_118._0_8_;
      std::
      vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
      ::emplace_back<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>
                ((vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
                  *)this,(list<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_118._0_8_);
      std::__cxx11::_List_base<DiskTableNode,_std::allocator<DiskTableNode>_>::_M_clear
                ((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_118);
    }
    local_11c = this->LEVEL_FACTOR * this->LEVEL0_LIMIT;
    local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (SSTableDataEntry *)0x0;
    local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (SSTableDataEntry *)0x0;
    local_58._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_58;
    local_58._M_impl._M_node._M_size = 0;
    local_a8 = local_40;
    local_58._M_impl._M_node.super__List_node_base._M_prev =
         local_58._M_impl._M_node.super__List_node_base._M_next;
    do {
      if (local_a8 ==
          (_List_node_base *)
          (this->diskView).
          super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        p_Var7 = (((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)&local_a8->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        local_f0 = (SSTableDataEntry *)p_Var7->_M_next;
        if (local_98._sstable == (SSTable *)0x0) {
          datas = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)0x0;
        }
        else {
          datas = SSTable::getAllData(local_98._sstable);
        }
        if ((SSTable *)local_f0->key == (SSTable *)0x0) {
          datas_1 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)0x0;
        }
        else {
          datas_1 = SSTable::getAllData((SSTable *)local_f0->key);
        }
        if ((SSTable *)p_Var7[1]._M_next == (SSTable *)0x0) {
          pvVar8 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)0x0;
        }
        else {
          pvVar8 = SSTable::getAllData((SSTable *)p_Var7[1]._M_next);
        }
        merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
                  ((SSTableData *)&local_e8,this,datas,datas_1,pvVar8);
        local_118._16_8_ =
             local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_118._8_8_ =
             local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_118._0_8_ =
             local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
             _M_impl.super__Vector_impl_data._M_start;
        psVar12 = (size_t *)&local_f0->key;
        local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e8._M_allocated_capacity;
        local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
        local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_d8;
        local_e8._M_allocated_capacity = 0;
        local_e8._8_8_ = (SSTableDataEntry *)0x0;
        local_d8 = (pointer)0x0;
        std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
                  ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_118);
        std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
                  ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)&local_e8);
        DiskTableNode::getFile_abi_cxx11_((path *)local_118,(DiskTableNode *)psVar12);
        std::__cxx11::
        list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        _M_insert<std::filesystem::__cxx11::path>
                  ((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    *)&local_58,(iterator)&local_58,(path *)local_118);
        std::filesystem::__cxx11::path::~path((path *)local_118);
        DiskTableNode::getFile_abi_cxx11_((path *)local_118,(DiskTableNode *)(p_Var7 + 1));
        std::__cxx11::
        list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        _M_insert<std::filesystem::__cxx11::path>
                  ((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    *)&local_58,(iterator)&local_58,(path *)local_118);
        std::filesystem::__cxx11::path::~path((path *)local_118);
        p_Var7 = local_40;
        std::__cxx11::_List_base<DiskTableNode,_std::allocator<DiskTableNode>_>::_M_clear
                  ((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_40);
        p_Var7->_M_prev = p_Var7;
        p_Var7->_M_next = p_Var7;
        p_Var7[1]._M_next = (_List_node_base *)0x0;
      }
      __position._M_node =
           ((level_00._M_current)->super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>).
           _M_impl._M_node.super__List_node_base._M_next;
      while (pSVar3 = local_c8.
                      super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
            __position._M_node != (_List_node_base *)level_00._M_current) {
        this_00 = (DiskTableNode *)(__position._M_node + 1);
        bVar6 = DiskTableNode::intersect(this_00,&local_c8);
        if (bVar6) {
          if (this_00->_sstable == (SSTable *)0x0) {
            pvVar8 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)0x0;
          }
          else {
            pvVar8 = SSTable::getAllData(this_00->_sstable);
          }
          merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
                    ((SSTableData *)&local_e8,this,&local_c8,pvVar8);
          local_118._16_8_ =
               local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_118._8_8_ =
               local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_118._0_8_ =
               local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_e8._M_allocated_capacity;
          local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
          local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_d8;
          local_e8._M_allocated_capacity = 0;
          local_e8._8_8_ = (SSTableDataEntry *)0x0;
          local_d8 = (pointer)0x0;
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_118);
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)&local_e8);
          SSTable::clearDataCache(this_00->_sstable);
          DiskTableNode::getFile_abi_cxx11_((path *)local_118,this_00);
          std::__cxx11::
          list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
          _M_insert<std::filesystem::__cxx11::path>
                    ((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                      *)&local_58,(iterator)&local_58,(path *)local_118);
          std::filesystem::__cxx11::path::~path((path *)local_118);
          p_Var7 = (__position._M_node)->_M_next;
          std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::_M_erase
                    (level_00._M_current,__position);
          __position._M_node = p_Var7;
        }
        else {
          __position._M_node = (__position._M_node)->_M_next;
        }
      }
      local_f0 = (SSTableDataEntry *)(long)local_11c;
      s = local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
          super__Vector_impl_data._M_start;
      if (local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
          super__Vector_impl_data._M_finish &&
          (SSTableDataEntry *)
          ((level_00._M_current)->super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>).
          _M_impl._M_node._M_size < local_f0) {
        do {
          local_e8._M_allocated_capacity = 0;
          local_e8._8_8_ = (SSTableDataEntry *)0x0;
          local_d8 = (pointer)0x0;
          local_a0 = 0;
          do {
            sVar9 = size_of_entry(s);
            local_a0 = local_a0 + sVar9;
            std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::push_back
                      ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)&local_e8,s);
            s = s + 1;
            if ((ulong)(long)this->SSTABLE_SIZE_LIMIT < local_a0) break;
          } while (s != pSVar3);
          local_78._sstable = (SSTable *)0x0;
          local_78.filter = (Filter *)0x0;
          local_78.index = (IndexMap *)0x0;
          DiskTableNode::fillData(&local_78,(SSTableData *)&local_e8);
          persistent::anon_class_8_1_8991fb9c::operator()((path *)local_118,&local_38,level_00);
          pSVar5 = local_78._sstable;
          if (local_78._sstable != (SSTable *)0x0) {
            SSTable::writeToDisk(local_78._sstable,(path *)local_118);
          }
          std::filesystem::__cxx11::path::~path((path *)local_118);
          SSTable::clearDataCache(pSVar5);
          p_Var7 = (_List_node_base *)operator_new(0x28);
          p_Var7[1]._M_next = (_List_node_base *)pSVar5;
          p_Var7[1]._M_prev = (_List_node_base *)local_78.filter;
          p_Var7[2]._M_next = (_List_node_base *)local_78.index;
          local_78._sstable = (SSTable *)0x0;
          local_78.filter = (Filter *)0x0;
          local_78.index = (IndexMap *)0x0;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar12 = &((level_00._M_current)->
                     super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>)._M_impl.
                     _M_node._M_size;
          *psVar12 = *psVar12 + 1;
          DiskTableNode::~DiskTableNode(&local_78);
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)&local_e8);
        } while (((SSTableDataEntry *)
                  ((level_00._M_current)->
                  super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>)._M_impl._M_node.
                  _M_size < local_f0) && (s != pSVar3));
      }
      p_Var7 = local_58._M_impl._M_node.super__List_node_base._M_next;
      if (s == pSVar3) {
        for (; pSVar4 = local_c8.
                        super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
            p_Var7 != (_List_node_base *)&local_58;
            p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next) {
          std::filesystem::remove((path *)(p_Var7 + 1));
        }
        if (local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl
            .super__Vector_impl_data._M_start) {
          local_f0 = local_c8.
                     super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl
                     .super__Vector_impl_data._M_start;
          paVar10 = &((local_c8.
                       super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                       _M_impl.super__Vector_impl_data._M_start)->value).field_2;
          do {
            plVar2 = (long *)(((string *)(paVar10 + -1))->_M_dataplus)._M_p;
            if (paVar10 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar10->_M_allocated_capacity + 1);
            }
            pSVar11 = (SSTableDataEntry *)(paVar10 + 1);
            paVar10 = paVar10 + 4;
          } while (pSVar11 != pSVar4);
          local_c8.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
          super__Vector_impl_data._M_finish = local_f0;
        }
      }
      else {
        level_00._M_current = level_00._M_current + 1;
        if (level_00._M_current ==
            (this->diskView).
            super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_118._16_8_ = (pointer)0x0;
          local_118._0_8_ = (SSTableDataEntry *)local_118;
          local_118._8_8_ = (SSTableDataEntry *)local_118;
          std::
          vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
          ::emplace_back<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>
                    ((vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
                      *)this,(list<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_118);
          std::__cxx11::_List_base<DiskTableNode,_std::allocator<DiskTableNode>_>::_M_clear
                    ((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_118);
        }
        local_a8 = (_List_node_base *)&local_a8[1]._M_prev;
        local_11c = local_11c * this->LEVEL_FACTOR;
      }
    } while (s != pSVar3);
    std::__cxx11::
    _List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    _M_clear(&local_58);
    std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_c8);
  }
  DiskTableNode::~DiskTableNode(&local_98);
  return;
}

Assistant:

void DiskTable::persistent(MemTable &&m, bool df) {
    auto new_disk_node = DiskTableNode{};
    new_disk_node.fillData(m.collectData());
    auto level0 = diskView.begin();
    auto writeFileName = [this](DiskViewLevelIter level) {
        this->SSTableClock += 1;
        auto parent_dir = this->db_home / path{std::to_string(std::distance(this->diskView.begin(), level))};
        if (!exists(parent_dir)) {
            create_directory(parent_dir);
        }
        return parent_dir / (path{std::to_string(this->SSTableClock) + ".bin"});
    };
    if (level0->size() < LEVEL0_LIMIT) {
        new_disk_node.writeToDisk(writeFileName(level0));
        new_disk_node.clearDataCache();
        level0->push_back(std::move(new_disk_node));
        return;
    }
    if (level0->size() == LEVEL0_LIMIT) {
        auto cur_level = diskView.begin();
        if (std::next(cur_level) == diskView.end()) {
            diskView.push_back(DiskViewLevel{});
        }
        auto compaction_into_level = std::next(cur_level);
        auto compaction_into_level_limit = LEVEL0_LIMIT * LEVEL_FACTOR;
        auto overflow_data = SSTableData{};
        auto to_remove_file = std::list<path>{};
        while (true) {
            if (cur_level == diskView.begin()) {
                auto level0_0 = cur_level->begin();
                auto level0_1 = std::next(level0_0, 1);
                overflow_data = merge(new_disk_node.getAllData(), level0_1->getAllData(), level0_0->getAllData());
                to_remove_file.push_back(level0_1->getFile());
                to_remove_file.push_back(level0_0->getFile());
                level0->clear();
            }

            for (auto to_compaction_node = compaction_into_level->begin();
                 to_compaction_node != compaction_into_level->end();) {
                if (to_compaction_node->intersect(overflow_data)) {
                    overflow_data = merge(&overflow_data, to_compaction_node->getAllData());
                    to_compaction_node->clearDataCache();
                    to_remove_file.push_back(to_compaction_node->getFile());
                    to_compaction_node = compaction_into_level->erase(to_compaction_node);
                    continue;
                }
                to_compaction_node++;
            }

            auto cur_overflow_entry = overflow_data.begin();
            auto overflow_end = overflow_data.end();

            while (compaction_into_level->size() < compaction_into_level_limit && cur_overflow_entry != overflow_end) {
                auto persistent_data_block = SSTableData{};
                volatile size_t blocked_data_bytes = 0;
                while (blocked_data_bytes <= SSTABLE_SIZE_LIMIT && cur_overflow_entry != overflow_end) {
                    blocked_data_bytes += size_of_entry(*cur_overflow_entry);
                    persistent_data_block.push_back(*cur_overflow_entry);
                    cur_overflow_entry++;
                }
                auto persistent_node = DiskTableNode{};
                persistent_node.fillData(std::move(persistent_data_block));
                persistent_node.writeToDisk(writeFileName(compaction_into_level));
                persistent_node.clearDataCache();
                compaction_into_level->push_back(std::move(persistent_node));
            }

            if (cur_overflow_entry == overflow_end) {
                std::for_each(to_remove_file.begin(), to_remove_file.end(), [](path &file) { remove(file); });
                overflow_data.clear();
                break;
            }

            if (std::next(compaction_into_level) == diskView.end()) {
                diskView.push_back(DiskViewLevel{});
            }

            cur_level++;
            compaction_into_level++;
            compaction_into_level_limit *= LEVEL_FACTOR;
        }
    }
}